

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O0

void __thiscall
duckdb::PrimitiveDictionary<unsigned_long,_unsigned_long,_duckdb::ParquetCastOperator>::Insert
          (PrimitiveDictionary<unsigned_long,_unsigned_long,_duckdb::ParquetCastOperator> *this,
          unsigned_long value)

{
  idx_t iVar1;
  bool bVar2;
  primitive_dictionary_entry_t *this_00;
  PrimitiveDictionary<unsigned_long,_unsigned_long,_duckdb::ParquetCastOperator> *in_RSI;
  PrimitiveDictionary<unsigned_long,_unsigned_long,_duckdb::ParquetCastOperator> *in_RDI;
  primitive_dictionary_entry_t *entry;
  unsigned_long *in_stack_ffffffffffffffe8;
  PrimitiveDictionary<unsigned_long,_unsigned_long,_duckdb::ParquetCastOperator> *this_01;
  
  if ((in_RDI->full & 1U) == 0) {
    this_01 = in_RDI;
    this_00 = Lookup(in_RSI,in_stack_ffffffffffffffe8);
    bVar2 = primitive_dictionary_entry_t::IsEmpty(this_00);
    if (bVar2) {
      if ((in_RDI->maximum_size < in_RDI->size + 1) ||
         (bVar2 = AddToTarget<unsigned_long,_0>(this_01,(unsigned_long *)in_RSI), !bVar2)) {
        in_RDI->full = true;
      }
      else {
        this_00->value = (unsigned_long)in_RSI;
        iVar1 = in_RDI->size;
        in_RDI->size = iVar1 + 1;
        this_00->index = (uint32_t)iVar1;
      }
    }
  }
  return;
}

Assistant:

void Insert(SRC value) {
		if (full) {
			return;
		}
		auto &entry = Lookup(value);
		if (entry.IsEmpty()) {
			if (size + 1 > maximum_size || !AddToTarget(value)) {
				full = true;
				return;
			}
			entry.value = value;
			entry.index = size++;
		}
	}